

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O2

void __thiscall libDAI::FactorGraph::ReadFromFile(FactorGraph *this,char *filename)

{
  char cVar1;
  Exception *this_00;
  allocator<char> local_249;
  string local_248;
  ifstream infile;
  
  std::ifstream::ifstream(&infile);
  std::ifstream::open((char *)&infile,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    operator>>((istream *)&infile,this);
    std::ifstream::close();
    std::ifstream::~ifstream(&infile);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"factorgraph.cpp, line 294",&local_249);
  Exception::Exception(this_00,5,&local_248);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FactorGraph::ReadFromFile( const char *filename ) {
        ifstream infile;
        infile.open( filename );
        if( infile.is_open() ) {
            try { // FIXME: no exceptions are generated by iostreams by default
                infile >> *this;
                infile.close();
            } catch (...) {
                infile.close();
                throw;
            }
        } else
            DAI_THROW(CANNOT_READ_FILE);
    }